

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccnr.cc
# Opt level: O0

void __thiscall CCNR::ls_solver::print_solution(ls_solver *this,bool need_verify)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  reference plVar5;
  reference pvVar6;
  void *this_00;
  byte in_SIL;
  __normal_iterator<CCNR::lit_*,_std::vector<CCNR::lit,_std::allocator<CCNR::lit>_>_> *in_RDI;
  size_t v;
  lit l;
  iterator __end3;
  iterator __begin3;
  vector<CCNR::lit,_std::allocator<CCNR::lit>_> *__range3;
  size_t c;
  bool sat_flag;
  vector<CCNR::lit,_std::allocator<CCNR::lit>_> *in_stack_ffffffffffffffa8;
  lit *local_48;
  uint local_40;
  __normal_iterator<CCNR::lit_*,_std::vector<CCNR::lit,_std::allocator<CCNR::lit>_>_> local_28;
  reference local_20;
  lit *local_18;
  byte local_a;
  byte local_9;
  
  local_9 = in_SIL & 1;
  iVar3 = get_cost((ls_solver *)0x166c91);
  if (iVar3 == 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"s SATISFIABLE");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cout,"s UNKNOWN");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  local_a = 0;
  if ((local_9 & 1) != 0) {
    for (local_18 = (lit *)0x0; local_18 < in_RDI[0xb]._M_current;
        local_18 = (lit *)&local_18->field_0x1) {
      local_a = 0;
      local_20 = std::vector<CCNR::clause,_std::allocator<CCNR::clause>_>::operator[]
                           ((vector<CCNR::clause,_std::allocator<CCNR::clause>_> *)(in_RDI + 7),
                            (size_type)local_18);
      local_28._M_current =
           (lit *)std::vector<CCNR::lit,_std::allocator<CCNR::lit>_>::begin
                            (in_stack_ffffffffffffffa8);
      std::vector<CCNR::lit,_std::allocator<CCNR::lit>_>::end(in_stack_ffffffffffffffa8);
      while (bVar2 = __gnu_cxx::operator!=
                               (in_RDI,(__normal_iterator<CCNR::lit_*,_std::vector<CCNR::lit,_std::allocator<CCNR::lit>_>_>
                                        *)in_stack_ffffffffffffffa8), bVar2) {
        plVar5 = __gnu_cxx::
                 __normal_iterator<CCNR::lit_*,_std::vector<CCNR::lit,_std::allocator<CCNR::lit>_>_>
                 ::operator*(&local_28);
        uVar1 = *(undefined8 *)plVar5;
        pvVar6 = std::vector<char,_std::allocator<char>_>::operator[]
                           ((vector<char,_std::allocator<char>_> *)(in_RDI + 0x1c),plVar5->var_num);
        local_40 = (uint)uVar1;
        if ((int)*pvVar6 == (local_40 & 1)) {
          local_a = 1;
          break;
        }
        __gnu_cxx::
        __normal_iterator<CCNR::lit_*,_std::vector<CCNR::lit,_std::allocator<CCNR::lit>_>_>::
        operator++(&local_28);
      }
      if ((local_a & 1) == 0) {
        poVar4 = std::operator<<((ostream *)&std::cout,"c Error: verify error in clause ");
        this_00 = (void *)std::ostream::operator<<(poVar4,(ulong)local_18);
        std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
        return;
      }
    }
    poVar4 = std::operator<<((ostream *)&std::cout,"c Verified.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  std::operator<<((ostream *)&std::cout,"v");
  for (local_48 = (lit *)0x1; local_48 <= in_RDI[10]._M_current;
      local_48 = (lit *)&local_48->field_0x1) {
    std::operator<<((ostream *)&std::cout,' ');
    pvVar6 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)(in_RDI + 0x1c),(size_type)local_48);
    if (*pvVar6 == '\0') {
      std::operator<<((ostream *)&std::cout,'-');
    }
    std::ostream::operator<<(&std::cout,(ulong)local_48);
  }
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void ls_solver::print_solution(bool need_verify)
{
    if (0 == get_cost())
        cout << "s SATISFIABLE" << endl;
    else
        cout << "s UNKNOWN" << endl;
    bool sat_flag = false;
    if (need_verify) {
        for (size_t c = 0; c < _num_clauses; c++) {
            sat_flag = false;
            for (lit l : _clauses[c].literals) {
                if (_solution[l.var_num] == l.sense) {
                    sat_flag = true;
                    break;
                }
            }
            if (!sat_flag) {
                cout << "c Error: verify error in clause " << c << endl;
                return;
            }
        }
        cout << "c Verified." << endl;
    }
    cout << "v";
    for (size_t v = 1; v <= _num_vars; v++) {
        cout << ' ';
        if (_solution[v] == 0) cout << '-';
        cout << v;
    }
    cout << endl;
}